

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeBlocksGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,string *make,
          char *makefile,string *target,string *makeFlags)

{
  bool bVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *path;
  char *path_00;
  string makefileName;
  string generator;
  allocator local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)make);
  if (makeFlags->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_48);
  bVar1 = std::operator==(&local_48,"NMake Makefiles");
  path = extraout_RDX;
  if (bVar1) {
LAB_004432f7:
    cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_68,(cmSystemTools *)makefile,path);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    bVar1 = std::operator==(&local_48,"NMake Makefiles JOM");
    path = extraout_RDX_00;
    if (bVar1) goto LAB_004432f7;
    bVar1 = std::operator==(&local_48,"MinGW Makefiles");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_68,makefile,&local_69);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      bVar1 = std::operator==(&local_48,"Ninja");
      if (bVar1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        goto LAB_00443344;
      }
      cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_68,(cmSystemTools *)makefile,path_00);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_68);
LAB_00443344:
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::BuildMakeCommand(
  const std::string& make, const char* makefile, const std::string& target,
  const std::string& makeFlags)
{
  std::string command = make;
  if (!makeFlags.empty()) {
    command += " ";
    command += makeFlags;
  }

  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles" || generator == "NMake Makefiles JOM") {
    // For Windows ConvertToOutputPath already adds quotes when required.
    // These need to be escaped, see
    // https://gitlab.kitware.com/cmake/cmake/issues/13952
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += " /NOLOGO /f ";
    command += makefileName;
    command += " VERBOSE=1 ";
    command += target;
  } else if (generator == "MinGW Makefiles") {
    // no escaping of spaces in this case, see
    // https://gitlab.kitware.com/cmake/cmake/issues/10014
    std::string makefileName = makefile;
    command += " -f \"";
    command += makefileName;
    command += "\" ";
    command += " VERBOSE=1 ";
    command += target;
  } else if (generator == "Ninja") {
    command += " -v ";
    command += target;
  } else {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += " -f \"";
    command += makefileName;
    command += "\" ";
    command += " VERBOSE=1 ";
    command += target;
  }
  return command;
}